

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void set_hero_sprite_for_room(tgestate_t *state)

{
  vischar_t *hero;
  tgestate_t *state_local;
  
  state->vischars[0].input = 0x80;
  if (state->room_index < 0x1d) {
    state->vischars[0].direction = state->vischars[0].direction & 0xfb;
  }
  else {
    state->vischars[0].direction = state->vischars[0].direction | 4;
    state->vischars[0].mi.sprite = sprites + 2;
  }
  return;
}

Assistant:

void set_hero_sprite_for_room(tgestate_t *state)
{
  vischar_t *hero; /* was HL */

  assert(state != NULL);

  hero = &state->vischars[0];
  hero->input = input_KICK;

  /* vischar_DIRECTION_CRAWL is set, or cleared, here but not tested
   * directly anywhere else so it must be an offset into animindices[].
   */

  /* When in tunnel rooms force the hero sprite to 'prisoner' and set the
   * crawl flag appropriately. */
  if (state->room_index >= room_29_SECOND_TUNNEL_START)
  {
    hero->direction |= vischar_DIRECTION_CRAWL;
    hero->mi.sprite = &sprites[sprite_PRISONER_FACING_AWAY_1];
  }
  else
  {
    hero->direction &= ~vischar_DIRECTION_CRAWL;
  }
}